

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

int google::protobuf::EncodeAsUTF8Char(uint32 code_point,char *output)

{
  size_t __n;
  
  __n = 1;
  if (0x7f < code_point) {
    if (code_point < 0x800) {
      code_point = (code_point & 0x3f) + (code_point & 0x7c0) * 4 + 0xc080;
      __n = 2;
    }
    else if (code_point < 0x10000) {
      code_point = (code_point & 0xf000) * 0x10 + (code_point & 0x3f) + (code_point & 0xfc0) * 4 +
                   0xe08080;
      __n = 3;
    }
    else {
      code_point = (code_point & 0x3f | (code_point & 0x3f000) << 4 | (code_point & 0x1c0000) << 6)
                   + (code_point & 0xfc0) * 4 + 0xf0808080;
      __n = 4;
    }
  }
  ghtonl(code_point);
  memcpy(output,&stack0xfffffffffffffff0 + -__n,__n);
  return (int)__n;
}

Assistant:

int EncodeAsUTF8Char(uint32 code_point, char* output) {
  uint32 tmp = 0;
  int len = 0;
  if (code_point <= 0x7f) {
    tmp = code_point;
    len = 1;
  } else if (code_point <= 0x07ff) {
    tmp = 0x0000c080 |
        ((code_point & 0x07c0) << 2) |
        (code_point & 0x003f);
    len = 2;
  } else if (code_point <= 0xffff) {
    tmp = 0x00e08080 |
        ((code_point & 0xf000) << 4) |
        ((code_point & 0x0fc0) << 2) |
        (code_point & 0x003f);
    len = 3;
  } else {
    // UTF-16 is only defined for code points up to 0x10FFFF, and UTF-8 is
    // normally only defined up to there as well.
    tmp = 0xf0808080 |
        ((code_point & 0x1c0000) << 6) |
        ((code_point & 0x03f000) << 4) |
        ((code_point & 0x000fc0) << 2) |
        (code_point & 0x003f);
    len = 4;
  }
  tmp = ghtonl(tmp);
  memcpy(output, reinterpret_cast<const char*>(&tmp) + sizeof(tmp) - len, len);
  return len;
}